

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int mbedtls_ssl_set_hostname(mbedtls_ssl_context *ssl,char *hostname)

{
  size_t __n;
  size_t n;
  char *pcVar1;
  
  if (hostname == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(hostname);
    if (0xff < __n) {
      return -0x7100;
    }
  }
  pcVar1 = ssl->hostname;
  if (pcVar1 != (char *)0x0) {
    n = strlen(pcVar1);
    mbedtls_zeroize(pcVar1,n);
    free(ssl->hostname);
  }
  if (hostname == (char *)0x0) {
    ssl->hostname = (char *)0x0;
  }
  else {
    pcVar1 = (char *)calloc(1,__n + 1);
    ssl->hostname = pcVar1;
    if (pcVar1 == (char *)0x0) {
      return -0x7f00;
    }
    memcpy(pcVar1,hostname,__n);
    pcVar1[__n] = '\0';
  }
  return 0;
}

Assistant:

int mbedtls_ssl_set_hostname( mbedtls_ssl_context *ssl, const char *hostname )
{
    /* Initialize to suppress unnecessary compiler warning */
    size_t hostname_len = 0;

    /* Check if new hostname is valid before
     * making any change to current one */
    if( hostname != NULL )
    {
        hostname_len = strlen( hostname );

        if( hostname_len > MBEDTLS_SSL_MAX_HOST_NAME_LEN )
            return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );
    }

    /* Now it's clear that we will overwrite the old hostname,
     * so we can free it safely */

    if( ssl->hostname != NULL )
    {
        mbedtls_zeroize( ssl->hostname, strlen( ssl->hostname ) );
        mbedtls_free( ssl->hostname );
    }

    /* Passing NULL as hostname shall clear the old one */

    if( hostname == NULL )
    {
        ssl->hostname = NULL;
    }
    else
    {
        ssl->hostname = mbedtls_calloc( 1, hostname_len + 1 );
        if( ssl->hostname == NULL )
            return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

        memcpy( ssl->hostname, hostname, hostname_len );

        ssl->hostname[hostname_len] = '\0';
    }

    return( 0 );
}